

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O2

void __thiscall GibbsSamplerFromHDP::runIteraions(GibbsSamplerFromHDP *this)

{
  ostream *poVar1;
  int t;
  ulong uVar2;
  int i;
  uint uVar3;
  int j;
  ulong uVar4;
  
  for (uVar3 = 0; uVar3 < this->_iterationNumber; uVar3 = uVar3 + 1) {
    (*this->_vptr_GibbsSamplerFromHDP[1])(this);
    for (uVar4 = 0; uVar4 < this->_J; uVar4 = uVar4 + 1) {
      for (uVar2 = 0;
          (uint)uVar2 <
          (this->_Tj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4]; uVar2 = (ulong)((uint)uVar2 + 1)) {
        (*this->_vptr_GibbsSamplerFromHDP[2])(this,uVar4 & 0xffffffff,uVar2,0);
      }
    }
    (*this->_vptr_GibbsSamplerFromHDP[8])(this,1);
    (*this->_vptr_GibbsSamplerFromHDP[9])(this);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void GibbsSamplerFromHDP::runIteraions(){//{{{
    for(int i=0; i<_iterationNumber; i++){
        this->sampleTji();
        for(int j=0; j<_J; j++){
            for(int t=0; t<_Tj[j]; t++){
                this->sampleKjt(j, t);
            }
        }
        this->calculateExpectations(true);
        this->calculateLogLikelihood();
        // this->checkNumbers();
        cout<<_K<<endl;
        // if((i > _burnIn - 1) && ((i + 1) % _samplingInterval == 0)){
            // this->storeSamples();
        // }
    }
    // this->calculateExpectations();
}